

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateRequestTimeIterativeAsync
               (HelicsFederate fed,HelicsTime requestTime,HelicsIterationRequest iterate,
               HelicsError *err)

{
  Federate *t;
  HelicsIterationRequest in_ESI;
  Federate *fedObj;
  IterationRequest in_stack_00000057;
  Federate *in_stack_00000058;
  Time in_stack_00000060;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  HelicsError *in_stack_ffffffffffffffc8;
  HelicsFederate in_stack_ffffffffffffffd0;
  
  t = getFed(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (t != (Federate *)0x0) {
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(double)t);
    anon_unknown.dwarf_4e9a2::getIterationRequest(in_ESI);
    helics::Federate::requestTimeIterativeAsync
              (in_stack_00000058,in_stack_00000060,in_stack_00000057);
  }
  return;
}

Assistant:

void helicsFederateRequestTimeIterativeAsync(HelicsFederate fed, HelicsTime requestTime, HelicsIterationRequest iterate, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->requestTimeIterativeAsync(requestTime, getIterationRequest(iterate));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}